

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

int anon_unknown.dwarf_96ee67::cmFileUploadProgressCallback
              (void *clientp,double dltotal,double dlnow,double ultotal,double ulnow)

{
  bool bVar1;
  string status;
  string local_30;
  
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  bVar1 = cURLProgressHelper::UpdatePercentage
                    ((cURLProgressHelper *)clientp,ulnow,ultotal,&local_30);
  if (bVar1) {
    cmMakefile::DisplayStatus
              (*(cmMakefile **)(*(long *)((long)clientp + 8) + 8),local_30._M_dataplus._M_p,-1.0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,
                    CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                             local_30.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

static int
  cmFileUploadProgressCallback(void *clientp,
                               double dltotal, double dlnow,
                               double ultotal, double ulnow)
    {
    cURLProgressHelper *helper =
    reinterpret_cast<cURLProgressHelper *>(clientp);

    static_cast<void>(dltotal);
    static_cast<void>(dlnow);

    std::string status;
    if (helper->UpdatePercentage(ulnow, ultotal, status))
      {
      cmFileCommand *fc = helper->GetFileCommand();
      cmMakefile *mf = fc->GetMakefile();
      mf->DisplayStatus(status.c_str(), -1);
      }

    return 0;
    }